

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyReceivedPdu.cpp
# Opt level: O0

void __thiscall DIS::ResupplyReceivedPdu::ResupplyReceivedPdu(ResupplyReceivedPdu *this)

{
  ResupplyReceivedPdu *this_local;
  
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ResupplyReceivedPdu_00272f90;
  EntityID::EntityID(&this->_receivingEntityID);
  EntityID::EntityID(&this->_supplyingEntityID);
  this->_numberOfSupplyTypes = '\0';
  this->_padding1 = 0;
  this->_padding2 = '\0';
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::vector(&this->_supplies);
  Pdu::setPduType((Pdu *)this,'\a');
  return;
}

Assistant:

ResupplyReceivedPdu::ResupplyReceivedPdu() : LogisticsFamilyPdu(),
   _receivingEntityID(), 
   _supplyingEntityID(), 
   _numberOfSupplyTypes(0), 
   _padding1(0), 
   _padding2(0)
{
    setPduType( 7 );
}